

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::Combo(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter,
                 void *data,int items_count,int popup_max_height_in_items)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  void *ptr_id;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [12];
  undefined1 auVar8 [64];
  char *item_text;
  char *preview_value;
  ImVec2 local_50;
  void *local_48;
  ImVec2 local_40;
  char *local_38;
  undefined1 extraout_var [56];
  
  pIVar4 = GImGui;
  auVar9 = in_ZMM0._4_12_;
  local_38 = (char *)0x0;
  iVar2 = *current_item;
  local_48 = data;
  if (iVar2 < items_count && -1 < iVar2) {
    auVar8._0_8_ = (*items_getter)(data,iVar2,&local_38);
    auVar8._8_56_ = extraout_var;
    auVar9 = auVar8._4_12_;
  }
  if ((popup_max_height_in_items != -1) && (((pIVar4->NextWindowData).Flags & 0x10) == 0)) {
    local_50.x = 0.0;
    local_50.y = 0.0;
    if (popup_max_height_in_items < 1) {
      local_40.y = 3.4028235e+38;
    }
    else {
      auVar7._0_4_ = (float)popup_max_height_in_items;
      auVar7._4_12_ = auVar9;
      fVar1 = (GImGui->Style).ItemSpacing.y;
      auVar7 = vfmsub213ss_fma(auVar7,ZEXT416((uint)(fVar1 + GImGui->FontSize)),ZEXT416((uint)fVar1)
                              );
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)(GImGui->Style).WindowPadding.y),
                               ZEXT416(0x40000000));
      local_40.y = auVar7._0_4_;
    }
    local_40.x = 3.4028235e+38;
    SetNextWindowSizeConstraints(&local_50,&local_40,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  bVar6 = false;
  bVar5 = BeginCombo(label,local_38,0);
  if (bVar5) {
    if (items_count < 1) {
      bVar6 = false;
    }
    else {
      ptr_id = (void *)0x0;
      bVar6 = false;
      do {
        PushID(ptr_id);
        uVar3 = *current_item;
        bVar5 = (*items_getter)(local_48,(int)ptr_id,(char **)&local_50);
        if (!bVar5) {
          local_50 = (ImVec2)0x435d29;
        }
        local_40.x = 0.0;
        local_40.y = 0.0;
        bVar5 = Selectable((char *)local_50,ptr_id == (void *)(ulong)uVar3,0,&local_40);
        if (bVar5) {
          bVar6 = true;
          *current_item = (int)ptr_id;
        }
        if (ptr_id == (void *)(ulong)uVar3) {
          SetItemDefaultFocus();
        }
        PopID();
        ptr_id = (void *)((long)ptr_id + 1);
      } while ((void *)(ulong)(uint)items_count != ptr_id);
    }
    EndPopup();
  }
  return bVar6;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int popup_max_height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Call the getter to obtain the preview string which is a parameter to BeginCombo()
    const char* preview_value = NULL;
    if (*current_item >= 0 && *current_item < items_count)
        items_getter(data, *current_item, &preview_value);

    // The old Combo() API exposed "popup_max_height_in_items". The new more general BeginCombo() API doesn't have/need it, but we emulate it here.
    if (popup_max_height_in_items != -1 && !(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint))
        SetNextWindowSizeConstraints(ImVec2(0,0), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));

    if (!BeginCombo(label, preview_value, ImGuiComboFlags_None))
        return false;

    // Display items
    // FIXME-OPT: Use clipper (but we need to disable it on the appearing frame to make sure our call to SetItemDefaultFocus() is processed)
    bool value_changed = false;
    for (int i = 0; i < items_count; i++)
    {
        PushID((void*)(intptr_t)i);
        const bool item_selected = (i == *current_item);
        const char* item_text;
        if (!items_getter(data, i, &item_text))
            item_text = "*Unknown item*";
        if (Selectable(item_text, item_selected))
        {
            value_changed = true;
            *current_item = i;
        }
        if (item_selected)
            SetItemDefaultFocus();
        PopID();
    }

    EndCombo();
    return value_changed;
}